

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t spvtools::val::NonUniformPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  uint uVar4;
  GroupOperation GVar5;
  spv_result_t sVar6;
  uint32_t uVar7;
  Op OVar8;
  int32_t iVar9;
  spv_result_t sVar10;
  Instruction *pIVar11;
  char *pcVar12;
  long lVar13;
  spv_result_t unaff_EBP;
  string operand;
  char *local_228;
  long local_220;
  char local_218;
  undefined7 uStack_217;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  OVar8 = (Op)uVar1;
  bVar3 = spvOpcodeIsNonUniformGroupOperation(OVar8);
  if (OVar8 + ~OpGroupNonUniformQuadAnyKHR < 0xfffffffe && bVar3) {
    uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    unaff_EBP = ValidateExecutionScope(_,inst,uVar4);
    if (unaff_EBP != SPV_SUCCESS) {
      return unaff_EBP;
    }
  }
  switch(OVar8) {
  case OpGroupNonUniformElect:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformElect(_,inst);
    return sVar10;
  case OpGroupNonUniformAll:
  case OpGroupNonUniformAny:
    bVar3 = ValidationState_t::IsBoolScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar3 = ValidationState_t::IsBoolScalarType(_,uVar7);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Predicate must be a boolean scalar type";
      lVar13 = 0x27;
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a boolean scalar type";
      lVar13 = 0x24;
    }
    goto LAB_0019e719;
  case OpGroupNonUniformAllEqual:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformAllEqual(_,inst);
    return sVar10;
  case OpGroupNonUniformBroadcast:
  case OpGroupNonUniformShuffle:
  case OpGroupNonUniformShuffleXor:
  case OpGroupNonUniformShuffleUp:
  case OpGroupNonUniformShuffleDown:
  case OpGroupNonUniformQuadBroadcast:
  case OpGroupNonUniformQuadSwap:
    sVar10 = (inst->inst_).type_id;
    bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,sVar10);
    if (((!bVar3) && (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,sVar10), !bVar3)) &&
       (bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,sVar10), !bVar3)) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Result must be a scalar or vector of integer, floating-point, or boolean type";
      lVar13 = 0x4d;
      goto LAB_0019e719;
    }
    sVar6 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if (sVar6 != sVar10) goto LAB_0019e213;
    break;
  case OpGroupNonUniformBroadcastFirst:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformBroadcastFirst(_,inst);
    return sVar10;
  case OpGroupNonUniformBallot:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformBallot(_,inst);
    return sVar10;
  case OpGroupNonUniformInverseBallot:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformInverseBallot(_,inst);
    return sVar10;
  case OpGroupNonUniformBallotBitExtract:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformBallotBitExtract(_,inst);
    return sVar10;
  case OpGroupNonUniformBallotBitCount:
    sVar10 = anon_unknown_1::ValidateGroupNonUniformBallotBitCount(_,inst);
    return sVar10;
  case OpGroupNonUniformBallotFindLSB:
  case OpGroupNonUniformBallotFindMSB:
    bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(inst->inst_).type_id);
    if (bVar3) {
      uVar7 = ValidationState_t::GetOperandTypeId(_,inst,3);
      bVar3 = ValidationState_t::IsUnsignedIntVectorType(_,uVar7);
      if ((bVar3) && (uVar7 = ValidationState_t::GetDimension(_,uVar7), uVar7 == 4)) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar12 = "Value must be a 4-component unsigned integer vector";
LAB_0019e46a:
      lVar13 = 0x33;
      goto LAB_0019e719;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "Result must be an unsigned integer scalar";
LAB_0019e4f0:
    lVar13 = 0x29;
    goto LAB_0019e719;
  case OpGroupNonUniformIAdd:
  case OpGroupNonUniformFAdd:
  case OpGroupNonUniformIMul:
  case OpGroupNonUniformFMul:
  case OpGroupNonUniformSMin:
  case OpGroupNonUniformUMin:
  case OpGroupNonUniformFMin:
  case OpGroupNonUniformSMax:
  case OpGroupNonUniformUMax:
  case OpGroupNonUniformFMax:
  case OpGroupNonUniformBitwiseAnd:
  case OpGroupNonUniformBitwiseOr:
  case OpGroupNonUniformBitwiseXor:
  case OpGroupNonUniformLogicalAnd:
  case OpGroupNonUniformLogicalOr:
  case OpGroupNonUniformLogicalXor:
    uVar1 = (inst->inst_).opcode;
    if ((uVar1 - 0x15e < 9) && ((0x125U >> (uVar1 - 0x15e & 0x1f) & 1) != 0)) {
      bVar3 = ValidationState_t::IsFloatScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be a floating-point scalar or vector";
        lVar13 = 0x30;
        goto LAB_0019e719;
      }
    }
    else if (uVar1 - 0x16a < 3) {
      bVar3 = ValidationState_t::IsBoolScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be a boolean scalar or vector";
        goto LAB_0019e4f0;
      }
    }
    else if ((uVar1 == 0x165) || (uVar1 == 0x162)) {
      bVar3 = ValidationState_t::IsUnsignedIntScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be an unsigned integer scalar or vector";
        goto LAB_0019e46a;
      }
    }
    else {
      bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(inst->inst_).type_id);
      if (!bVar3) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Result must be an integer scalar or vector";
        lVar13 = 0x2a;
        goto LAB_0019e719;
      }
    }
    uVar7 = ValidationState_t::GetOperandTypeId(_,inst,4);
    if (uVar7 == (inst->inst_).type_id) {
      GVar5 = Instruction::GetOperandAs<spv::GroupOperation>(inst,3);
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x60) {
        if (GVar5 - GroupOperationPartitionedReduceNV < 3) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = 
          "Ballot must be present when Operation is PartitionedReduceNV, PartitionedInclusiveScanNV, or PartitionedExclusiveScanNV"
          ;
          lVar13 = 0x77;
        }
        else {
          if (GVar5 != ClusteredReduce) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar12 = "ClusterSize must be present when Operation is ClusteredReduce";
          lVar13 = 0x3d;
        }
        goto LAB_0019e719;
      }
      uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,5);
      pIVar11 = ValidationState_t::FindDef(_,uVar4);
      if (GVar5 - GroupOperationPartitionedReduceNV < 3) {
        if (((pIVar11 != (Instruction *)0x0) &&
            (bVar3 = ValidationState_t::IsIntScalarOrVectorType(_,(pIVar11->inst_).type_id), bVar3))
           && (uVar7 = ValidationState_t::GetDimension(_,(pIVar11->inst_).type_id), uVar7 == 4)) {
LAB_0019e612:
          bVar3 = true;
          goto LAB_0019e6b2;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "Ballot must be a 4-component integer vector";
        lVar13 = 0x2b;
      }
      else if ((pIVar11 == (Instruction *)0x0) ||
              (bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,(pIVar11->inst_).type_id),
              !bVar3)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "ClusterSize must be an unsigned integer scalar";
        lVar13 = 0x2e;
      }
      else {
        iVar9 = spvOpcodeIsConstant((uint)(pIVar11->inst_).opcode);
        if (iVar9 != 0) goto LAB_0019e612;
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar12 = "ClusterSize must be a constant instruction";
        lVar13 = 0x2a;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar13);
      DiagnosticStream::~DiagnosticStream(&local_208);
      bVar3 = false;
      unaff_EBP = local_208.error_;
LAB_0019e6b2:
      if (bVar3) {
        return SPV_SUCCESS;
      }
      return unaff_EBP;
    }
LAB_0019e213:
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar12 = "The type of Value must match the Result type";
    lVar13 = 0x2c;
LAB_0019e719:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar12,lVar13);
    DiagnosticStream::~DiagnosticStream(&local_208);
    return local_208.error_;
  default:
    if (uVar1 == 0x114f) {
      sVar10 = anon_unknown_1::ValidateGroupNonUniformRotateKHR(_,inst);
      return sVar10;
    }
    return SPV_SUCCESS;
  }
  uVar7 = ValidationState_t::GetOperandTypeId(_,inst,4);
  bVar3 = ValidationState_t::IsUnsignedIntScalarType(_,uVar7);
  if (!bVar3) {
    uVar1 = (inst->inst_).opcode;
    local_220 = 0;
    local_218 = '\0';
    if (uVar1 < 0x15a) {
      if ((uVar1 == 0x151) || (uVar1 == 0x159)) {
        pcVar12 = "Id";
        goto LAB_0019e76f;
      }
    }
    else {
      if (uVar1 == 0x15a) {
        pcVar12 = "Mask";
        goto LAB_0019e76f;
      }
      if (uVar1 == 0x16d) {
        pcVar12 = "Index";
        goto LAB_0019e76f;
      }
      if (uVar1 == 0x16e) {
        pcVar12 = "Direction";
        goto LAB_0019e76f;
      }
    }
    pcVar12 = "Delta";
LAB_0019e76f:
    local_228 = &local_218;
    std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,(ulong)pcVar12);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,local_228,local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208," must be an unsigned integer scalar",0x23);
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (local_228 != &local_218) {
      operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
      return local_208.error_;
    }
    return local_208.error_;
  }
  uVar2 = (inst->inst_).opcode;
  if (uVar2 == 0x151) {
LAB_0019e181:
    if (0x104ff < _->version_) {
      return SPV_SUCCESS;
    }
  }
  else if (uVar2 != 0x16e) {
    if (uVar2 != 0x16d) {
      return SPV_SUCCESS;
    }
    goto LAB_0019e181;
  }
  uVar4 = Instruction::GetOperandAs<unsigned_int>(inst,4);
  OVar8 = ValidationState_t::GetIdOpcode(_,uVar4);
  iVar9 = spvOpcodeIsConstant(OVar8);
  if (iVar9 != 0) goto LAB_0019e8d7;
  uVar1 = (inst->inst_).opcode;
  local_220 = 0;
  local_218 = '\0';
  if (uVar1 < 0x15a) {
    if ((uVar1 == 0x151) || (uVar1 == 0x159)) {
      pcVar12 = "Id";
    }
    else {
LAB_0019e847:
      pcVar12 = "Delta";
    }
  }
  else if (uVar1 == 0x15a) {
    pcVar12 = "Mask";
  }
  else if (uVar1 == 0x16d) {
    pcVar12 = "Index";
  }
  else {
    if (uVar1 != 0x16e) goto LAB_0019e847;
    pcVar12 = "Direction";
  }
  local_228 = &local_218;
  std::__cxx11::string::_M_replace((ulong)&local_228,0,(char *)0x0,(ulong)pcVar12);
  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208,"Before SPIR-V 1.5, ",0x13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,local_228,local_220);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_208," must be a constant instruction",0x1f);
  DiagnosticStream::~DiagnosticStream(&local_208);
  sVar10 = local_208.error_;
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
LAB_0019e8d7:
  if (iVar9 != 0) {
    return SPV_SUCCESS;
  }
  return sVar10;
}

Assistant:

spv_result_t NonUniformPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();

  if (spvOpcodeIsNonUniformGroupOperation(opcode)) {
    // OpGroupNonUniformQuadAllKHR and OpGroupNonUniformQuadAnyKHR don't have
    // scope paramter
    if ((opcode != spv::Op::OpGroupNonUniformQuadAllKHR) &&
        (opcode != spv::Op::OpGroupNonUniformQuadAnyKHR)) {
      const uint32_t execution_scope = inst->GetOperandAs<uint32_t>(2);
      if (auto error = ValidateExecutionScope(_, inst, execution_scope)) {
        return error;
      }
    }
  }

  switch (opcode) {
    case spv::Op::OpGroupNonUniformElect:
      return ValidateGroupNonUniformElect(_, inst);
    case spv::Op::OpGroupNonUniformAny:
    case spv::Op::OpGroupNonUniformAll:
      return ValidateGroupNonUniformAnyAll(_, inst);
    case spv::Op::OpGroupNonUniformAllEqual:
      return ValidateGroupNonUniformAllEqual(_, inst);
    case spv::Op::OpGroupNonUniformBroadcast:
    case spv::Op::OpGroupNonUniformShuffle:
    case spv::Op::OpGroupNonUniformShuffleXor:
    case spv::Op::OpGroupNonUniformShuffleUp:
    case spv::Op::OpGroupNonUniformShuffleDown:
    case spv::Op::OpGroupNonUniformQuadBroadcast:
    case spv::Op::OpGroupNonUniformQuadSwap:
      return ValidateGroupNonUniformBroadcastShuffle(_, inst);
    case spv::Op::OpGroupNonUniformBroadcastFirst:
      return ValidateGroupNonUniformBroadcastFirst(_, inst);
    case spv::Op::OpGroupNonUniformBallot:
      return ValidateGroupNonUniformBallot(_, inst);
    case spv::Op::OpGroupNonUniformInverseBallot:
      return ValidateGroupNonUniformInverseBallot(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitExtract:
      return ValidateGroupNonUniformBallotBitExtract(_, inst);
    case spv::Op::OpGroupNonUniformBallotBitCount:
      return ValidateGroupNonUniformBallotBitCount(_, inst);
    case spv::Op::OpGroupNonUniformBallotFindLSB:
    case spv::Op::OpGroupNonUniformBallotFindMSB:
      return ValidateGroupNonUniformBallotFind(_, inst);
    case spv::Op::OpGroupNonUniformIAdd:
    case spv::Op::OpGroupNonUniformFAdd:
    case spv::Op::OpGroupNonUniformIMul:
    case spv::Op::OpGroupNonUniformFMul:
    case spv::Op::OpGroupNonUniformSMin:
    case spv::Op::OpGroupNonUniformUMin:
    case spv::Op::OpGroupNonUniformFMin:
    case spv::Op::OpGroupNonUniformSMax:
    case spv::Op::OpGroupNonUniformUMax:
    case spv::Op::OpGroupNonUniformFMax:
    case spv::Op::OpGroupNonUniformBitwiseAnd:
    case spv::Op::OpGroupNonUniformBitwiseOr:
    case spv::Op::OpGroupNonUniformBitwiseXor:
    case spv::Op::OpGroupNonUniformLogicalAnd:
    case spv::Op::OpGroupNonUniformLogicalOr:
    case spv::Op::OpGroupNonUniformLogicalXor:
      return ValidateGroupNonUniformArithmetic(_, inst);
    case spv::Op::OpGroupNonUniformRotateKHR:
      return ValidateGroupNonUniformRotateKHR(_, inst);
    default:
      break;
  }

  return SPV_SUCCESS;
}